

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall
mir::inst::CallInst::CallInst
          (CallInst *this,VarId *_dest,string *_func,
          vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *_params)

{
  VarId *in_RCX;
  Inst *in_RDX;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *in_RSI;
  VarId *in_RDI;
  VarId local_30;
  Inst *__x;
  
  __x = in_RDX;
  VarId::VarId(&local_30,in_RCX);
  Inst::Inst(in_RDX,in_RDI);
  (in_RDI->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_00370160;
  std::__cxx11::string::string((string *)&in_RDI[1].id,(string *)in_RDX);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            (in_RSI,(vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)__x);
  return;
}

Assistant:

CallInst(VarId _dest, std::string _func, std::vector<Value> _params)
      : Inst(_dest), func(_func), params(_params) {}